

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall
diligent_spirv_cross::CompilerGLSL::fixup_io_block_patch_primitive_qualifiers
          (CompilerGLSL *this,SPIRVariable *var)

{
  uint32_t uVar1;
  bool bVar2;
  SPIRType *pSVar3;
  Decoration decoration;
  uint32_t uVar4;
  uint32_t i;
  
  pSVar3 = Variant::get<diligent_spirv_cross::SPIRType>
                     ((this->super_Compiler).ir.ids.super_VectorView<diligent_spirv_cross::Variant>.
                      ptr + *(uint *)&(var->super_IVariant).field_0xc);
  bVar2 = Compiler::has_decoration(&this->super_Compiler,(ID)(pSVar3->super_IVariant).self.id,Block)
  ;
  if ((bVar2) &&
     (uVar1 = (uint32_t)
              (pSVar3->member_types).
              super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>.
              buffer_size, uVar1 != 0)) {
    uVar4 = 0;
    do {
      decoration = DecorationPatch;
      bVar2 = Compiler::has_member_decoration
                        (&this->super_Compiler,(TypeID)(pSVar3->super_IVariant).self.id,uVar4,
                         DecorationPatch);
      if (bVar2) {
LAB_0072bbdb:
        uVar4 = 0;
        Compiler::set_decoration
                  (&this->super_Compiler,(ID)(var->super_IVariant).self.id,decoration,0);
        do {
          Compiler::unset_member_decoration
                    (&this->super_Compiler,(TypeID)(pSVar3->super_IVariant).self.id,uVar4,decoration
                    );
          uVar4 = uVar4 + 1;
        } while (uVar1 != uVar4);
        return;
      }
      decoration = DecorationPerPrimitiveEXT;
      bVar2 = Compiler::has_member_decoration
                        (&this->super_Compiler,(TypeID)(pSVar3->super_IVariant).self.id,uVar4,
                         DecorationPerPrimitiveEXT);
      if (bVar2) goto LAB_0072bbdb;
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  return;
}

Assistant:

void CompilerGLSL::fixup_io_block_patch_primitive_qualifiers(const SPIRVariable &var)
{
	// Works around weird behavior in glslangValidator where
	// a patch out block is translated to just block members getting the decoration.
	// To make glslang not complain when we compile again, we have to transform this back to a case where
	// the variable itself has Patch decoration, and not members.
	// Same for perprimitiveEXT.
	auto &type = get<SPIRType>(var.basetype);
	if (has_decoration(type.self, DecorationBlock))
	{
		uint32_t member_count = uint32_t(type.member_types.size());
		Decoration promoted_decoration = {};
		bool do_promote_decoration = false;
		for (uint32_t i = 0; i < member_count; i++)
		{
			if (has_member_decoration(type.self, i, DecorationPatch))
			{
				promoted_decoration = DecorationPatch;
				do_promote_decoration = true;
				break;
			}
			else if (has_member_decoration(type.self, i, DecorationPerPrimitiveEXT))
			{
				promoted_decoration = DecorationPerPrimitiveEXT;
				do_promote_decoration = true;
				break;
			}
		}

		if (do_promote_decoration)
		{
			set_decoration(var.self, promoted_decoration);
			for (uint32_t i = 0; i < member_count; i++)
				unset_member_decoration(type.self, i, promoted_decoration);
		}
	}
}